

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O2

void sel2_symbol(t_sel2 *x,t_symbol *s)

{
  _outlet **pp_Var1;
  int iVar2;
  bool bVar3;
  
  if (x->x_type == A_SYMBOL) {
    iVar2 = (int)x->x_nelement;
    pp_Var1 = &x->x_vec->e_outlet;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      if ((((t_selectelement *)(pp_Var1 + -1))->e_w).w_symbol == s) {
        outlet_bang(*pp_Var1);
        return;
      }
      pp_Var1 = pp_Var1 + 2;
    }
  }
  outlet_symbol(x->x_rejectout,s);
  return;
}

Assistant:

static void sel2_symbol(t_sel2 *x, t_symbol *s)
{
    t_selectelement *e;
    int nelement;
    if (x->x_type == A_SYMBOL)
    {
        for (nelement = (int)x->x_nelement, e = x->x_vec; nelement--; e++)
            if (e->e_w.w_symbol == s)
        {
            outlet_bang(e->e_outlet);
            return;
        }
    }
    outlet_symbol(x->x_rejectout, s);
}